

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O2

wchar_t match_owner_name_mbs(archive_match *a,match_list *list,char *name)

{
  wchar_t wVar1;
  int iVar2;
  int *piVar3;
  char *p;
  
  wVar1 = L'\0';
  if ((name != (char *)0x0) && (*name != '\0')) {
    do {
      list = (match_list *)((match *)list)->next;
      if ((match *)list == (match *)0x0) {
        return L'\0';
      }
      wVar1 = archive_mstring_get_mbs(&a->archive,&((match *)list)->pattern,&p);
      if ((wVar1 < L'\0') && (piVar3 = __errno_location(), *piVar3 == 0xc)) {
        error_nomem(a);
        return L'\xffffffe2';
      }
    } while ((p == (char *)0x0) || (iVar2 = strcmp(p,name), iVar2 != 0));
    ((match *)list)->matches = ((match *)list)->matches + 1;
    wVar1 = L'\x01';
  }
  return wVar1;
}

Assistant:

static int
match_owner_name_mbs(struct archive_match *a, struct match_list *list,
    const char *name)
{
	struct match *m;
	const char *p;

	if (name == NULL || *name == '\0')
		return (0);
	for (m = list->first; m; m = m->next) {
		if (archive_mstring_get_mbs(&(a->archive), &(m->pattern), &p)
		    < 0 && errno == ENOMEM)
			return (error_nomem(a));
		if (p != NULL && strcmp(p, name) == 0) {
			m->matches++;
			return (1);
		}
	}
	return (0);
}